

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_local_wall(REF_GRID ref_grid,REF_DICT ref_dict,REF_INT *node_per_ptr,REF_INT *param_4,
                   REF_DBL **param_5)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_BOOL RVar6;
  int iVar7;
  REF_DBL *pRVar8;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT node;
  REF_INT i;
  REF_CELL ref_cell;
  REF_INT node_per;
  REF_DBL *local_xyz;
  REF_INT local_ncell;
  REF_NODE ref_node;
  REF_DBL **local_xyz_ptr_local;
  REF_INT *local_ncell_ptr_local;
  REF_INT *node_per_ptr_local;
  REF_DICT ref_dict_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  if (ref_grid->twod == 0) {
    _node = ref_grid->cell[3];
  }
  else {
    _node = ref_grid->cell[0];
  }
  iVar1 = _node->node_per;
  local_xyz._4_4_ = 0;
  for (nodes[0x19] = 0; nodes[0x19] < _node->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar4 = ref_cell_nodes(_node,nodes[0x19],&ref_private_macro_code_rxs);
    if (RVar4 == 0) {
      ref_private_macro_code_rxs_1 = -1;
      uVar5 = ref_dict_value(ref_dict,(&ref_private_macro_code_rxs)[_node->node_per],
                             &ref_private_macro_code_rxs_1);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x5f4,"ref_phys_local_wall",(ulong)uVar5,"bc");
        return uVar5;
      }
      RVar6 = ref_phys_wall_distance_bc(ref_private_macro_code_rxs_1);
      if (RVar6 != 0) {
        local_xyz._4_4_ = local_xyz._4_4_ + 1;
      }
    }
  }
  if (ref_grid->twod == 0) {
    pRVar3 = ref_grid->cell[6];
    for (nodes[0x19] = 0; nodes[0x19] < pRVar3->max; nodes[0x19] = nodes[0x19] + 1) {
      RVar4 = ref_cell_nodes(pRVar3,nodes[0x19],&ref_private_macro_code_rxs);
      if (RVar4 == 0) {
        ref_private_macro_code_rxs_1 = -1;
        uVar5 = ref_dict_value(ref_dict,(&ref_private_macro_code_rxs)[pRVar3->node_per],
                               &ref_private_macro_code_rxs_1);
        if ((uVar5 != 0) && (uVar5 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x5fe,"ref_phys_local_wall",(ulong)uVar5,"bc");
          return uVar5;
        }
        RVar6 = ref_phys_wall_distance_bc(ref_private_macro_code_rxs_1);
        if (RVar6 != 0) {
          local_xyz._4_4_ = local_xyz._4_4_ + 2;
        }
      }
    }
    _node = ref_grid->cell[3];
  }
  if (iVar1 * 3 * local_xyz._4_4_ < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
           "ref_phys_local_wall","malloc local_xyz of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pRVar8 = (REF_DBL *)malloc((long)(iVar1 * 3 * local_xyz._4_4_) << 3);
    if (pRVar8 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x605,
             "ref_phys_local_wall","malloc local_xyz of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      local_xyz._4_4_ = 0;
      for (nodes[0x19] = 0; nodes[0x19] < _node->max; nodes[0x19] = nodes[0x19] + 1) {
        RVar4 = ref_cell_nodes(_node,nodes[0x19],&ref_private_macro_code_rxs);
        if (RVar4 == 0) {
          ref_private_macro_code_rxs_1 = -1;
          uVar5 = ref_dict_value(ref_dict,(&ref_private_macro_code_rxs)[_node->node_per],
                                 &ref_private_macro_code_rxs_1);
          if ((uVar5 != 0) && (uVar5 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x60a,"ref_phys_local_wall",(ulong)uVar5,"bc");
            return uVar5;
          }
          RVar6 = ref_phys_wall_distance_bc(ref_private_macro_code_rxs_1);
          if (RVar6 != 0) {
            for (nodes[0x1a] = 0; nodes[0x1a] < iVar1; nodes[0x1a] = nodes[0x1a] + 1) {
              for (cell = 0; cell < 3; cell = cell + 1) {
                pRVar8[cell + nodes[0x1a] * 3 + iVar1 * 3 * local_xyz._4_4_] =
                     pRVar2->real[cell + (&ref_private_macro_code_rxs)[nodes[0x1a]] * 0xf];
              }
            }
            local_xyz._4_4_ = local_xyz._4_4_ + 1;
          }
        }
      }
      if (ref_grid->twod == 0) {
        pRVar3 = ref_grid->cell[6];
        for (nodes[0x19] = 0; nodes[0x19] < pRVar3->max; nodes[0x19] = nodes[0x19] + 1) {
          RVar4 = ref_cell_nodes(pRVar3,nodes[0x19],&ref_private_macro_code_rxs);
          if (RVar4 == 0) {
            ref_private_macro_code_rxs_1 = -1;
            uVar5 = ref_dict_value(ref_dict,(&ref_private_macro_code_rxs)[pRVar3->node_per],
                                   &ref_private_macro_code_rxs_1);
            if ((uVar5 != 0) && (uVar5 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x61a,"ref_phys_local_wall",(ulong)uVar5,"bc");
              return uVar5;
            }
            RVar6 = ref_phys_wall_distance_bc(ref_private_macro_code_rxs_1);
            if (RVar6 != 0) {
              for (cell = 0; cell < 3; cell = cell + 1) {
                pRVar8[cell + iVar1 * 3 * local_xyz._4_4_] =
                     pRVar2->real[cell + ref_private_macro_code_rxs * 0xf];
                pRVar8[cell + 3 + iVar1 * 3 * local_xyz._4_4_] = pRVar2->real[cell + bc * 0xf];
                pRVar8[cell + 6 + iVar1 * 3 * local_xyz._4_4_] = pRVar2->real[cell + nodes[0] * 0xf]
                ;
              }
              iVar7 = local_xyz._4_4_ + 1;
              for (cell = 0; cell < 3; cell = cell + 1) {
                pRVar8[cell + iVar1 * 3 * iVar7] =
                     pRVar2->real[cell + ref_private_macro_code_rxs * 0xf];
                pRVar8[cell + 3 + iVar1 * 3 * iVar7] = pRVar2->real[cell + nodes[0] * 0xf];
                pRVar8[cell + 6 + iVar1 * 3 * iVar7] = pRVar2->real[cell + nodes[1] * 0xf];
              }
              local_xyz._4_4_ = local_xyz._4_4_ + 2;
            }
          }
        }
      }
      *node_per_ptr = iVar1;
      *param_4 = local_xyz._4_4_;
      *param_5 = pRVar8;
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_local_wall(REF_GRID ref_grid,
                                              REF_DICT ref_dict,
                                              REF_INT *node_per_ptr,
                                              REF_INT *local_ncell_ptr,
                                              REF_DBL **local_xyz_ptr) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT local_ncell;
  REF_DBL *local_xyz;
  REF_INT node_per;
  REF_CELL ref_cell;
  REF_INT i, node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT bc;

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  node_per = ref_cell_node_per(ref_cell);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        local_ncell += 2;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }
  ref_malloc(local_xyz, 3 * node_per * local_ncell, REF_DBL);
  local_ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      for (node = 0; node < node_per; node++) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * node + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[node]);
        }
      }
      local_ncell++;
    }
  }
  if (!ref_grid_twod(ref_grid)) { /* adds quads as two tri */
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[1]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
        }
        local_ncell += 1;
        for (i = 0; i < 3; i++) {
          local_xyz[i + 3 * 0 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[0]);
          local_xyz[i + 3 * 1 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[2]);
          local_xyz[i + 3 * 2 + 3 * node_per * local_ncell] =
              ref_node_xyz(ref_node, i, nodes[3]);
        }
        local_ncell += 1;
      }
    }
    ref_cell = ref_grid_tri(ref_grid);
  }

  *node_per_ptr = node_per;
  *local_ncell_ptr = local_ncell;
  *local_xyz_ptr = local_xyz;

  return REF_SUCCESS;
}